

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O2

bool SerializeContextState(SSL_CTX *ctx,CBB *cbb)

{
  pointer ppsVar1;
  bool bVar2;
  int iVar3;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *__range1;
  ssl_session_st **sess;
  pointer ppsVar4;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> sessions;
  CBB out;
  uint8_t keys [48];
  CBB ticket_keys;
  CBB ctx_sessions;
  
  iVar3 = CBB_add_u24_length_prefixed(cbb,&out);
  if (iVar3 != 0) {
    iVar3 = CBB_add_u16(&out,0);
    if (iVar3 == 0) {
      return false;
    }
    iVar3 = SSL_CTX_get_tlsext_ticket_keys(ctx,keys,0x30);
    if ((((iVar3 != 0) && (iVar3 = CBB_add_u8_length_prefixed(&out,&ticket_keys), iVar3 != 0)) &&
        (iVar3 = CBB_add_bytes(&ticket_keys,keys,0x30), iVar3 != 0)) &&
       (iVar3 = CBB_add_asn1(&out,&ctx_sessions,0x20000010), iVar3 != 0)) {
      sessions.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sessions.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sessions.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lh_SSL_SESSION_doall_arg(ctx->sessions,push_session,&sessions);
      ppsVar1 = sessions.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppsVar4 = sessions.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if (ppsVar4 == ppsVar1) {
          iVar3 = CBB_flush(cbb);
          bVar2 = iVar3 != 0;
          goto LAB_0012d902;
        }
        bVar2 = bssl::ssl_session_serialize(*ppsVar4,&ctx_sessions);
        ppsVar4 = ppsVar4 + 1;
      } while (bVar2);
      bVar2 = false;
LAB_0012d902:
      std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base
                (&sessions.super__Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool SerializeContextState(SSL_CTX *ctx, CBB *cbb) {
  CBB out, ctx_sessions, ticket_keys;
  uint8_t keys[48];
  if (!CBB_add_u24_length_prefixed(cbb, &out) ||
      !CBB_add_u16(&out, 0 /* version */) ||
      !SSL_CTX_get_tlsext_ticket_keys(ctx, &keys, sizeof(keys)) ||
      !CBB_add_u8_length_prefixed(&out, &ticket_keys) ||
      !CBB_add_bytes(&ticket_keys, keys, sizeof(keys)) ||
      !CBB_add_asn1(&out, &ctx_sessions, CBS_ASN1_SEQUENCE)) {
    return false;
  }
  std::vector<SSL_SESSION *> sessions;
  lh_SSL_SESSION_doall_arg(ctx->sessions, push_session, &sessions);
  for (const auto &sess : sessions) {
    if (!ssl_session_serialize(sess, &ctx_sessions)) {
      return false;
    }
  }
  return CBB_flush(cbb);
}